

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

DETACH_HANDLE detach_create(handle handle_value)

{
  int iVar1;
  DETACH_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  DETACH_INSTANCE *detach_instance;
  
  __ptr = (DETACH_HANDLE)malloc(8);
  if (__ptr != (DETACH_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x16);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_create_uint(handle_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return __ptr;
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (DETACH_HANDLE)0x0;
}

Assistant:

DETACH_HANDLE detach_create(handle handle_value)
{
    DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)malloc(sizeof(DETACH_INSTANCE));
    if (detach_instance != NULL)
    {
        detach_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(22);
        if (detach_instance->composite_value == NULL)
        {
            free(detach_instance);
            detach_instance = NULL;
        }
        else
        {
            AMQP_VALUE handle_amqp_value;
            int result = 0;

            handle_amqp_value = amqpvalue_create_handle(handle_value);
            if ((result == 0) && (amqpvalue_set_composite_item(detach_instance->composite_value, 0, handle_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(handle_amqp_value);
            if (result != 0)
            {
                detach_destroy(detach_instance);
                detach_instance = NULL;
            }
        }
    }

    return detach_instance;
}